

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

value_type * __thiscall
google::
sparse_hashtable<std::pair<int_const,Memmove>,int,Hasher,google::sparse_hash_map<int,Memmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>::SelectKey,google::sparse_hash_map<int,Memmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>
::
find_or_insert<google::sparse_hash_map<int,Memmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>::DefaultValue>
          (sparse_hashtable<std::pair<int_const,Memmove>,int,Hasher,google::sparse_hash_map<int,Memmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>::SelectKey,google::sparse_hash_map<int,Memmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>
           *this,key_type *key)

{
  bool bVar1;
  pair<unsigned_long,_unsigned_long> pVar2;
  pair<const_int,_Memmove> local_70;
  pair<google::sparse_hashtable_iterator<std::pair<const_int,_Memmove>,_int,_Hasher,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SelectKey,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>,_bool>
  local_68;
  
  pVar2 = sparse_hashtable<std::pair<const_int,_Memmove>,_int,_Hasher,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SelectKey,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
          ::find_position<int>
                    ((sparse_hashtable<std::pair<const_int,_Memmove>,_int,_Hasher,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SelectKey,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
                      *)this,key);
  if (pVar2.first == 0xffffffffffffffff) {
    bVar1 = sparse_hashtable<std::pair<const_int,_Memmove>,_int,_Hasher,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SelectKey,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
            ::resize_delta((sparse_hashtable<std::pair<const_int,_Memmove>,_int,_Hasher,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SelectKey,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
                            *)this,1);
    if (bVar1) {
      local_70.first = *key;
      local_70.second.i = 0;
      Memmove::num_copies = Memmove::num_copies + 2;
      sparse_hashtable<std::pair<const_int,_Memmove>,_int,_Hasher,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SelectKey,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
      ::insert_noresize(&local_68,
                        (sparse_hashtable<std::pair<const_int,_Memmove>,_int,_Hasher,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SelectKey,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
                         *)this,&local_70);
      local_68.first.pos.row_current._M_current =
           (sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
            *)local_68.first.pos.col_current;
    }
    else {
      local_70.first = *key;
      local_70.second.i = 0;
      Memmove::num_copies = Memmove::num_copies + 2;
      sparse_hashtable<std::pair<const_int,_Memmove>,_int,_Hasher,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SelectKey,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
      ::insert_at(&local_68.first,
                  (sparse_hashtable<std::pair<const_int,_Memmove>,_int,_Hasher,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SelectKey,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
                   *)this,&local_70,pVar2.second);
      local_68.first.pos.row_current._M_current =
           (sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
            *)local_68.first.pos.col_current;
    }
  }
  else {
    sparsetable<std::pair<const_int,_Memmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
    ::get_iter((nonempty_iterator *)&local_68,
               (sparsetable<std::pair<const_int,_Memmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
                *)(this + 0x48),pVar2.first);
  }
  return (value_type *)local_68.first.pos.row_current._M_current;
}

Assistant:

value_type& find_or_insert(const key_type& key) {
    // First, double-check we're not inserting delkey
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) &&
           "Inserting the deleted key");
    const std::pair<size_type, size_type> pos = find_position(key);
    DefaultValue default_value;
    if (pos.first != ILLEGAL_BUCKET) {  // object was already there
      return *table.get_iter(pos.first);
    } else if (resize_delta(1)) {  // needed to rehash to make room
      // Since we resized, we can't use pos, so recalculate where to
      // insert.
      return *insert_noresize(default_value(key)).first;
    } else {  // no need to rehash, insert right here
      return *insert_at(default_value(key), pos.second);
    }
  }